

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigmund~.c
# Opt level: O1

void sigmund_tweak(int npts,t_float *ftreal,t_float *ftimag,int npeak,t_peak_conflict *peaks,
                  t_float fperbin,int loud)

{
  uint *puVar1;
  float *pfVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  long lVar6;
  float fVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  ulong __nmemb;
  long *plVar13;
  bool bVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  undefined8 uStack_160;
  uint local_158 [2];
  t_peak_conflict negpeak;
  float local_a0 [2];
  t_float ampreal [3];
  t_float ampimag [3];
  
  lVar6 = -((long)npeak * 8 + 0x17U & 0xfffffffffffffff0);
  plVar13 = (long *)((long)local_158 + lVar6);
  if (0 < npeak) {
    fVar7 = (float)npts;
    __nmemb = (ulong)(uint)npeak;
    uVar9 = 0;
    do {
      *(t_peak_conflict **)((long)&negpeak + uVar9 * 8 + lVar6) = peaks;
      uVar9 = uVar9 + 1;
      peaks = peaks + 1;
    } while (__nmemb != uVar9);
    *(undefined8 *)((long)&uStack_160 + lVar6) = 0x1ad917;
    qsort((void *)((long)&negpeak + lVar6),__nmemb,8,sigmund_cmp_freq);
    *plVar13 = (long)local_158;
    puVar1 = *(uint **)((long)&negpeak + lVar6);
    negpeak.p_freq = (t_float)puVar1[2];
    negpeak.p_amp = -(float)puVar1[3];
    local_158[0] = *puVar1 ^ 0x80000000;
    uVar9 = 1;
    do {
      iVar8 = (int)(*(float *)plVar13[uVar9] * (1.0 / fperbin) + 0.5);
      if ((-1 < iVar8) && (iVar8 <= npts * 2 + -3)) {
        lVar10 = 0;
        do {
          iVar11 = (int)lVar10 + iVar8 + -2;
          *(t_float *)((long)local_a0 + lVar10 * 2) = ftreal[iVar11];
          *(t_float *)((long)ampreal + lVar10 * 2 + 4) = ftimag[iVar11];
          lVar10 = lVar10 + 2;
        } while (lVar10 != 6);
        lVar10 = 0;
        do {
          pfVar2 = *(float **)((long)&uStack_160 + lVar10 * 0x10 + uVar9 * 8 + lVar6);
          fVar17 = pfVar2[2] * (float)npts;
          fVar18 = pfVar2[3] * (float)npts;
          negpeak.p_salience = -fVar18;
          negpeak.p_tmp = -0.0;
          lVar12 = 0;
          do {
            fVar21 = (*pfVar2 * -(1.0 / fperbin) + (float)((int)lVar12 + iVar8 + -2)) * 1.5707964;
            *(undefined8 *)((long)&uStack_160 + lVar6) = 0x1adaa5;
            dVar3 = sin((double)fVar21);
            dVar4 = (double)(((fVar7 + -0.5) / fVar7) * fVar21);
            *(undefined8 *)((long)&uStack_160 + lVar6) = 0x1adad8;
            dVar5 = cos(dVar4);
            *(undefined8 *)((long)&uStack_160 + lVar6) = 0x1adae7;
            dVar4 = sin(dVar4);
            fVar19 = -1.0;
            if (0.003 <= ABS(fVar21)) {
              fVar19 = -(float)dVar3 / fVar21;
            }
            fVar21 = *(float *)((long)ampreal + lVar12 * 2 + 4);
            *(float *)((long)local_a0 + lVar12 * 2) =
                 ((float)dVar5 * fVar17 + negpeak.p_salience * (float)dVar4) * fVar19 +
                 *(float *)((long)local_a0 + lVar12 * 2);
            *(float *)((long)ampreal + lVar12 * 2 + 4) =
                 ((float)dVar4 * fVar17 + fVar18 * (float)dVar5) * fVar19 + fVar21;
            lVar12 = lVar12 + 2;
          } while (lVar12 != 6);
        } while ((uVar9 != __nmemb) && (bVar14 = lVar10 == 0, lVar10 = lVar10 + 1, bVar14));
        fVar19 = (float)((double)local_a0[1] * 0.5 + (double)(local_a0[0] + ampreal[0]) * -0.25);
        fVar21 = (float)((double)ampreal[2] * 0.5 + (double)(ampreal[1] + ampimag[0]) * -0.25);
        dVar3 = (double)(fVar19 * fVar19 + fVar21 * fVar21);
        fVar18 = (float)((((double)ampreal[2] - (double)(ampreal[1] + ampimag[0]) * 0.5) *
                          (double)(ampreal[1] - ampimag[0]) * 0.5 +
                         ((double)local_a0[1] - (double)(local_a0[0] + ampreal[0]) * 0.5) *
                         (double)(local_a0[0] - ampreal[0]) * 0.5) / (dVar3 * 4.0));
        fVar17 = 0.5;
        if ((fVar18 <= 0.5) && (fVar17 = fVar18, fVar18 < -0.5)) {
          fVar17 = -0.5;
        }
        fVar18 = fVar17 * 3.1415927;
        dVar4 = (double)fVar18;
        *(undefined8 *)((long)&uStack_160 + lVar6) = 0x1add10;
        dVar5 = sin(dVar4);
        fVar15 = (float)dVar5;
        *(undefined8 *)((long)&uStack_160 + lVar6) = 0x1add23;
        dVar5 = cos(dVar4);
        fVar16 = 1.0;
        if (0.003 <= ABS((float)(dVar4 + 3.141592653589793))) {
          fVar16 = fVar15 / (float)(dVar4 + 3.141592653589793);
        }
        fVar20 = 1.0;
        if (0.003 <= ABS((float)(dVar4 + -3.141592653589793))) {
          fVar20 = fVar15 / (float)(dVar4 + -3.141592653589793);
        }
        if (dVar3 < 0.0) {
          *(undefined8 *)((long)&uStack_160 + lVar6) = 0x1ade52;
          dVar3 = sqrt(dVar3);
        }
        else {
          dVar3 = SQRT(dVar3);
        }
        fVar18 = (1.0 / (float)((double)(-(ulong)(ABS(fVar18) < 0.003) & 0x3ff0000000000000 |
                                        ~-(ulong)(ABS(fVar18) < 0.003) &
                                        (ulong)(double)(fVar15 / fVar18)) * 0.5 +
                               (double)(fVar16 + fVar20) * -0.25)) * (1.0 / fVar7);
        pfVar2 = (float *)plVar13[uVar9];
        *pfVar2 = (fVar17 + fVar17 + (float)iVar8) * fperbin;
        pfVar2[1] = (float)((double)fVar18 * dVar3);
        pfVar2[2] = (fVar19 * (float)dVar5 - fVar21 * fVar15) * fVar18;
        pfVar2[3] = (fVar19 * fVar15 + fVar21 * (float)dVar5) * fVar18;
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != npeak + 1);
  }
  return;
}

Assistant:

static void sigmund_tweak(int npts, t_float *ftreal, t_float *ftimag,
    int npeak, t_peak *peaks, t_float fperbin, int loud)
{
    t_peak **peakptrs = (t_peak **)alloca(sizeof (*peakptrs) * (npeak+1));
    t_peak negpeak;
    int peaki, j, k;
    t_float ampreal[3], ampimag[3];
    t_float binperf = 1./fperbin;
    t_float phaseperbin = (npts-0.5)/npts, oneovern = 1./npts;
    if (npeak < 1)
        return;
    for (peaki = 0; peaki < npeak; peaki++)
        peakptrs[peaki+1] = &peaks[peaki];
    qsort(peakptrs+1, npeak, sizeof (*peakptrs), sigmund_cmp_freq);
    peakptrs[0] = &negpeak;
    negpeak.p_ampreal = peakptrs[1]->p_ampreal;
    negpeak.p_ampimag = -peakptrs[1]->p_ampimag;
    negpeak.p_freq = -peakptrs[1]->p_freq;
    for (peaki = 1; peaki <= npeak; peaki++)
    {
        int cbin = peakptrs[peaki]->p_freq*binperf + 0.5;
        int nsub = (peaki == npeak ? 1:2);
        t_float windreal, windimag, windpower, detune, pidetune, sinpidetune,
            cospidetune, ampcorrect, ampout, ampoutreal, ampoutimag, freqout;
        /* post("3 nsub %d amp %f freq %f", nsub,
            peakptrs[peaki]->p_amp, peakptrs[peaki]->p_freq); */
        if (cbin < 0 || cbin > 2*npts - 3)
            continue;
        for (j = 0; j < 3; j++)
            ampreal[j] = ftreal[cbin+2*j-2], ampimag[j] = ftimag[cbin+2*j-2];
        /* post("a %f %f", ampreal[1], ampimag[1]); */
        for (j = 0; j < nsub; j++)
        {
            t_peak *neighbor = peakptrs[(peaki-1) + 2*j];
            t_float neighborreal = npts * neighbor->p_ampreal;
            t_float neighborimag = npts * neighbor->p_ampimag;
            for (k = 0; k < 3; k++)
            {
                t_float freqdiff = (0.5*PI) * ((cbin + 2*k-2)
                    -binperf * neighbor->p_freq);
                t_float sx = sinx(freqdiff, sin(freqdiff));
                t_float phasere = cos(freqdiff * phaseperbin);
                t_float phaseim = sin(freqdiff * phaseperbin);
                ampreal[k] -=
                    sx * (phasere * neighborreal - phaseim * neighborimag);
                ampimag[k] -=
                    sx * (phaseim * neighborreal + phasere * neighborimag);
            }       
            /* post("b %f %f", ampreal[1], ampimag[1]); */
        }

        windreal = W_ALPHA * ampreal[1] -
            (0.5 * W_BETA) * (ampreal[0] + ampreal[2]);
        windimag = W_ALPHA * ampimag[1] -
            (0.5 * W_BETA) * (ampimag[0] + ampimag[2]);
        windpower = windreal * windreal + windimag * windimag;
        detune = (
            W_BETA*(ampreal[0] - ampreal[2]) * 
                (2.0*W_ALPHA * ampreal[1] - W_BETA * (ampreal[0] + ampreal[2]))
                    +
            W_BETA*(ampimag[0] - ampimag[2]) *
                (2.0*W_ALPHA * ampimag[1] - W_BETA * (ampimag[0] + ampimag[2]))
                        ) / (4.0 * windpower);
        if (detune > 0.5)
            detune = 0.5;
        else if (detune < -0.5)
            detune = -0.5;
        /* if (loud > 0)
            post("tweak: windpower %f, bin %d, detune %f",
                windpower, cbin, detune); */
        pidetune = PI * detune;
        sinpidetune = sin(pidetune);
        cospidetune = cos(pidetune);

        ampcorrect = 1.0 / window_hann_mag(pidetune, sinpidetune);

        ampout = oneovern * ampcorrect *sqrt(windpower);
        ampoutreal = oneovern * ampcorrect *
            (windreal * cospidetune - windimag * sinpidetune);
        ampoutimag = oneovern * ampcorrect *
            (windreal * sinpidetune + windimag * cospidetune);
        freqout = (cbin + 2*detune) * fperbin;
        /* if (loud > 1)
            post("amp %f, freq %f", ampout, freqout); */
        
        peakptrs[peaki]->p_freq = freqout;
        peakptrs[peaki]->p_amp = ampout;
        peakptrs[peaki]->p_ampreal = ampoutreal;
        peakptrs[peaki]->p_ampimag = ampoutimag;
    }
}